

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,BlockVariable *var)

{
  long lVar1;
  Data *pDVar2;
  QDebug *pQVar3;
  QByteArray *in_RDX;
  long in_FS_OFFSET;
  QLatin1StringView t;
  undefined1 local_60 [24];
  undefined1 local_48 [8];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)var);
  *(undefined1 *)&(var->name).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int> = 0;
  pQVar3 = QDebug::operator<<((QDebug *)var,"BlockVariable(");
  t = typeStr(*(VariableType *)&in_RDX[1].d.d);
  pQVar3 = QDebug::operator<<(pQVar3,t);
  pQVar3 = QDebug::operator<<(pQVar3,' ');
  QDebug::operator<<(pQVar3,in_RDX);
  if (*(int *)((long)&in_RDX[1].d.d + 4) != -1) {
    *(undefined1 *)&(var->name).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int> = 0;
    pQVar3 = QDebug::operator<<((QDebug *)var," offset=");
    QDebug::operator<<(pQVar3,*(int *)((long)&in_RDX[1].d.d + 4));
  }
  *(undefined1 *)&(var->name).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int> = 0;
  pQVar3 = QDebug::operator<<((QDebug *)var," size=");
  QDebug::operator<<(pQVar3,*(int *)&in_RDX[1].d.ptr);
  if (in_RDX[2].d.ptr != (char *)0x0) {
    *(undefined1 *)&(var->name).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int> = 0;
    pQVar3 = QDebug::operator<<((QDebug *)var," array=");
    local_60._16_8_ = pQVar3->stream;
    ((Stream *)local_60._16_8_)->ref = ((Stream *)local_60._16_8_)->ref + 1;
    operator<<((Stream *)local_48,(QList<int> *)(local_60 + 0x10));
    QDebug::~QDebug((QDebug *)local_48);
    QDebug::~QDebug((QDebug *)(local_60 + 0x10));
  }
  if ((int)in_RDX[2].d.size != 0) {
    *(undefined1 *)&(var->name).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int> = 0;
    pQVar3 = QDebug::operator<<((QDebug *)var," arrayStride=");
    QDebug::operator<<(pQVar3,(int)in_RDX[2].d.size);
  }
  if (*(int *)((long)&in_RDX[2].d.size + 4) != 0) {
    *(undefined1 *)&(var->name).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int> = 0;
    pQVar3 = QDebug::operator<<((QDebug *)var," matrixStride=");
    QDebug::operator<<(pQVar3,*(int *)((long)&in_RDX[2].d.size + 4));
  }
  if (*(char *)&in_RDX[3].d.d == '\x01') {
    *(undefined1 *)&(var->name).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int> = 0;
    QDebug::operator<<((QDebug *)var," [rowmaj]");
  }
  if (in_RDX[4].d.d != (Data *)0x0) {
    *(undefined1 *)&(var->name).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int> = 0;
    pQVar3 = QDebug::operator<<((QDebug *)var," structMembers=");
    local_60._0_8_ = pQVar3->stream;
    ((Stream *)local_60._0_8_)->ref = ((Stream *)local_60._0_8_)->ref + 1;
    operator<<((Stream *)(local_60 + 8),(QList<QShaderDescription::BlockVariable> *)local_60);
    QDebug::~QDebug((QDebug *)(local_60 + 8));
    QDebug::~QDebug((QDebug *)local_60);
  }
  *(undefined1 *)&(var->name).d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int> = 0;
  QDebug::operator<<((QDebug *)var,')');
  pDVar2 = (var->name).d.d;
  (var->name).d.d = (Data *)0x0;
  *(Data **)dbg.stream = pDVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QShaderDescription::BlockVariable &var)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "BlockVariable(" << typeStr(var.type) << ' ' << var.name;
    if (var.offset != -1)
        dbg.nospace() << " offset=" << var.offset;
    dbg.nospace() << " size=" << var.size;
    if (!var.arrayDims.isEmpty())
        dbg.nospace() << " array=" << var.arrayDims;
    if (var.arrayStride)
        dbg.nospace() << " arrayStride=" << var.arrayStride;
    if (var.matrixStride)
        dbg.nospace() << " matrixStride=" << var.matrixStride;
    if (var.matrixIsRowMajor)
        dbg.nospace() << " [rowmaj]";
    if (!var.structMembers.isEmpty())
        dbg.nospace() << " structMembers=" << var.structMembers;
    dbg.nospace() << ')';
    return dbg;
}